

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void RangeEnc_Encode(CPpmd7z_RangeEnc *p,UInt32 start,UInt32 size,UInt32 total)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (ulong)p->Range / (ulong)total;
  p->Low = p->Low + start * uVar1;
  uVar2 = size * (int)uVar1;
  p->Range = uVar2;
  while (uVar2 < 0x1000000) {
    p->Range = uVar2 << 8;
    RangeEnc_ShiftLow(p);
    uVar2 = p->Range;
  }
  return;
}

Assistant:

static void RangeEnc_Encode(CPpmd7z_RangeEnc *p, UInt32 start, UInt32 size, UInt32 total)
{
  p->Low += (UInt64)start * (UInt64)(p->Range /= total);
  p->Range *= size;
  while (p->Range < kTopValue)
  {
    p->Range <<= 8;
    RangeEnc_ShiftLow(p);
  }
}